

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

void __thiscall
cmGeneratorTarget::ComputeKindedSources(cmGeneratorTarget *this,KindedSources *files,string *config)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  pointer pcVar2;
  cmSourceFile *pcVar3;
  cmake *this_00;
  undefined8 uVar4;
  uint uVar5;
  bool bVar6;
  int iVar7;
  string *psVar8;
  cmCustomCommand *pcVar9;
  long *plVar10;
  ostream *poVar11;
  cmSourceFileLocation *pcVar12;
  element_type *peVar13;
  cmSourceFile **ppcVar14;
  uint uVar15;
  pointer sourceName;
  pair<std::_Rb_tree_iterator<cmSourceFile_*>,_bool> pVar16;
  cmSourceFile *sf;
  string xaml;
  string hFileName;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> badObjLib;
  string cppFileName;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  srcs;
  set<cmSourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_> emitted;
  string ext;
  RegularExpression header_regex;
  cmSourceFile *local_368;
  undefined1 local_360 [32];
  cmGeneratorTarget *local_340;
  undefined1 local_338 [16];
  undefined1 local_328 [32];
  undefined1 local_308 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f0;
  KindedSources *local_2e0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2d8;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_2d0;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_2c8;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2c0;
  _Rb_tree<cmSourceFile_*,_cmSourceFile_*,_std::_Identity<cmSourceFile_*>,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_>
  local_2a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268 [6];
  ios_base local_208 [264];
  RegularExpression local_100;
  
  local_340 = this;
  local_2e0 = files;
  GetSourceFilePaths(&local_2c0,this,config);
  local_100.regmatch.startp[0] = (char *)0x0;
  local_100.regmatch.endp[0] = (char *)0x0;
  local_100.regmatch.searchstring = (char *)0x0;
  local_100.program = (char *)0x0;
  cmsys::RegularExpression::compile(&local_100,"\\.(h|hh|h\\+\\+|hm|hpp|hxx|in|txx|inl)$");
  local_328._16_8_ = (cmSourceFile **)0x0;
  local_328._24_8_ = (cmSourceFile **)0x0;
  local_308._0_8_ = (pointer)0x0;
  local_2a8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_2a8._M_impl.super__Rb_tree_header._M_header;
  local_2a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2a8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2a8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_2a8._M_impl.super__Rb_tree_header._M_header._M_left;
  if (local_2c0.
      super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_2c0.
      super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_2d0 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                 *)&local_2e0->ExpectedXamlHeaders;
    local_2d8._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_2e0->ExpectedXamlSources;
    local_2c8 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                 *)&local_2e0->ExpectedResxHeaders;
    sourceName = local_2c0.
                 super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_368 = cmMakefile::GetOrCreateSource
                            (local_340->Makefile,&sourceName->Value,false,Ambiguous);
      pVar16 = std::
               _Rb_tree<cmSourceFile*,cmSourceFile*,std::_Identity<cmSourceFile*>,std::less<cmSourceFile*>,std::allocator<cmSourceFile*>>
               ::_M_insert_unique<cmSourceFile*const&>
                         ((_Rb_tree<cmSourceFile*,cmSourceFile*,std::_Identity<cmSourceFile*>,std::less<cmSourceFile*>,std::allocator<cmSourceFile*>>
                           *)&local_2a8,&local_368);
      if (((undefined1  [16])pVar16 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        psVar8 = cmSourceFile::GetExtension_abi_cxx11_(local_368);
        cmsys::SystemTools::LowerCase((string *)&local_278,psVar8);
        pcVar9 = cmSourceFile::GetCustomCommand(local_368);
        pcVar3 = local_368;
        uVar15 = 2;
        if ((pcVar9 == (cmCustomCommand *)0x0) &&
           (uVar15 = 4, local_340->Target->TargetTypeValue != UTILITY)) {
          local_360._0_8_ = local_360 + 0x10;
          local_338._0_8_ = (element_type *)0x10;
          local_360._0_8_ = std::__cxx11::string::_M_create((ulong *)local_360,(ulong)local_338);
          local_360._16_7_ = (undefined7)local_338._0_8_;
          local_360[0x17] = SUB81(local_338._0_8_,7);
          builtin_strncpy((char *)local_360._0_8_,"HEADER_FILE_ONLY",0x10);
          local_360._8_8_ = local_338._0_8_;
          *(char *)(local_360._0_8_ + local_338._0_8_) = '\0';
          bVar6 = cmSourceFile::GetPropertyAsBool(pcVar3,(string *)local_360);
          if ((undefined1 *)local_360._0_8_ != local_360 + 0x10) {
            operator_delete((void *)local_360._0_8_,CONCAT17(local_360[0x17],local_360._16_7_) + 1);
          }
          uVar15 = 5;
          if (!bVar6) {
            local_360._24_4_ = 0x4a424f5f;
            local_360._28_3_ = 0x544345;
            local_360._16_7_ = 0x414e5245545845;
            local_360[0x17] = 'L';
            local_360._8_8_ = (element_type *)0xf;
            local_360[0x1f] = '\0';
            local_360._0_8_ = local_360 + 0x10;
            bVar6 = cmSourceFile::GetPropertyAsBool(local_368,(string *)local_360);
            if ((undefined1 *)local_360._0_8_ != local_360 + 0x10) {
              operator_delete((void *)local_360._0_8_,CONCAT17(local_360[0x17],local_360._16_7_) + 1
                             );
            }
            uVar15 = 3;
            if (!bVar6) {
              cmSourceFile::GetLanguage_abi_cxx11_((string *)local_360,local_368);
              uVar4 = local_360._8_8_;
              if ((undefined1 *)local_360._0_8_ != local_360 + 0x10) {
                operator_delete((void *)local_360._0_8_,
                                CONCAT17(local_360[0x17],local_360._16_7_) + 1);
              }
              uVar15 = 9;
              if ((element_type *)uVar4 == (element_type *)0x0) {
                iVar7 = std::__cxx11::string::compare(local_278._M_local_buf);
                if (iVar7 == 0) {
                  uVar15 = 8;
                  if (local_340->Target->TargetTypeValue == OBJECT_LIBRARY) {
                    uVar5 = 8;
                    if (local_328._24_8_ == local_308._0_8_) {
                      std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>::
                      _M_realloc_insert<cmSourceFile*const&>
                                ((vector<cmSourceFile*,std::allocator<cmSourceFile*>> *)
                                 (local_328 + 0x10),(iterator)local_328._24_8_,&local_368);
                    }
                    else {
LAB_00272d8d:
                      uVar15 = uVar5;
                      *(cmSourceFile **)local_328._24_8_ = local_368;
                      local_328._24_8_ = local_328._24_8_ + 8;
                    }
                  }
                }
                else {
                  iVar7 = std::__cxx11::string::compare(local_278._M_local_buf);
                  if (iVar7 == 0) {
                    uVar15 = 6;
                    if (local_340->Target->TargetTypeValue == OBJECT_LIBRARY) {
                      uVar5 = 6;
                      if (local_328._24_8_ != local_308._0_8_) goto LAB_00272d8d;
                      std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>::
                      _M_realloc_insert<cmSourceFile*const&>
                                ((vector<cmSourceFile*,std::allocator<cmSourceFile*>> *)
                                 (local_328 + 0x10),(iterator)local_328._24_8_,&local_368);
                    }
                  }
                  else {
                    iVar7 = std::__cxx11::string::compare(local_278._M_local_buf);
                    if (iVar7 == 0) {
                      psVar8 = cmSourceFile::GetFullPath(local_368,(string *)0x0);
                      local_360._0_8_ = local_360 + 0x10;
                      pcVar2 = (psVar8->_M_dataplus)._M_p;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)local_360,pcVar2,pcVar2 + psVar8->_M_string_length);
                      std::__cxx11::string::rfind((char)(string *)local_360,0x2e);
                      std::__cxx11::string::substr((ulong)(local_308 + 8),(ulong)local_360);
                      plVar10 = (long *)std::__cxx11::string::append(local_308 + 8);
                      peVar13 = (element_type *)(plVar10 + 2);
                      if ((element_type *)*plVar10 == peVar13) {
                        local_328._0_8_ = (peVar13->field_0).Bottom.State;
                        local_328._8_8_ = plVar10[3];
                        local_338._0_8_ = (element_type *)local_328;
                      }
                      else {
                        local_328._0_8_ = (peVar13->field_0).Bottom.State;
                        local_338._0_8_ = (element_type *)*plVar10;
                      }
                      local_338._8_8_ = plVar10[1];
                      *plVar10 = (long)peVar13;
                      plVar10[1] = 0;
                      *(undefined1 *)(plVar10 + 2) = 0;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_308._8_8_ != &local_2f0) {
                        operator_delete((void *)local_308._8_8_,local_2f0._M_allocated_capacity + 1)
                        ;
                      }
                      std::
                      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      ::_M_insert_unique<std::__cxx11::string_const&>
                                (local_2c8,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_338);
                      if ((element_type *)local_338._0_8_ != (element_type *)local_328) {
                        operator_delete((void *)local_338._0_8_,
                                        (ulong)&(((
                                                  map<cmProperty::ScopeType,_cmPropertyDefinitionMap,_std::less<cmProperty::ScopeType>,_std::allocator<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>_>
                                                  *)local_328._0_8_)->_M_t)._M_impl.field_0x1);
                      }
                      if ((undefined1 *)local_360._0_8_ != local_360 + 0x10) {
                        operator_delete((void *)local_360._0_8_,
                                        CONCAT17(local_360[0x17],local_360._16_7_) + 1);
                      }
                      uVar15 = 10;
                    }
                    else {
                      iVar7 = std::__cxx11::string::compare(local_278._M_local_buf);
                      if (iVar7 == 0) {
                        uVar15 = 0;
                      }
                      else {
                        iVar7 = std::__cxx11::string::compare(local_278._M_local_buf);
                        if (iVar7 == 0) {
                          uVar15 = 7;
                        }
                        else {
                          iVar7 = std::__cxx11::string::compare(local_278._M_local_buf);
                          if (iVar7 == 0) {
                            uVar15 = 1;
                          }
                          else {
                            iVar7 = std::__cxx11::string::compare(local_278._M_local_buf);
                            if (iVar7 == 0) {
                              psVar8 = cmSourceFile::GetFullPath(local_368,(string *)0x0);
                              local_360._0_8_ = local_360 + 0x10;
                              pcVar2 = (psVar8->_M_dataplus)._M_p;
                              std::__cxx11::string::_M_construct<char*>
                                        ((string *)local_360,pcVar2,
                                         pcVar2 + psVar8->_M_string_length);
                              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)local_338,
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)local_360,".h");
                              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)(local_308 + 8),
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)local_360,".cpp");
                              std::
                              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                              ::_M_insert_unique<std::__cxx11::string_const&>
                                        (local_2d0,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_338);
                              std::
                              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                              ::_M_insert_unique<std::__cxx11::string_const&>
                                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                          *)local_2d8._M_pi,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)(local_308 + 8));
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_308._8_8_ != &local_2f0) {
                                operator_delete((void *)local_308._8_8_,
                                                local_2f0._M_allocated_capacity + 1);
                              }
                              if ((element_type *)local_338._0_8_ != (element_type *)local_328) {
                                operator_delete((void *)local_338._0_8_,
                                                (ulong)&(((
                                                  map<cmProperty::ScopeType,_cmPropertyDefinitionMap,_std::less<cmProperty::ScopeType>,_std::allocator<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>_>
                                                  *)local_328._0_8_)->_M_t)._M_impl.field_0x1);
                              }
                              if ((undefined1 *)local_360._0_8_ != local_360 + 0x10) {
                                operator_delete((void *)local_360._0_8_,
                                                CONCAT17(local_360[0x17],local_360._16_7_) + 1);
                              }
                              uVar15 = 0xb;
                            }
                            else {
                              psVar8 = cmSourceFile::GetFullPath(local_368,(string *)0x0);
                              bVar6 = cmsys::RegularExpression::find
                                                (&local_100,(psVar8->_M_dataplus)._M_p,
                                                 &local_100.regmatch);
                              uVar15 = bVar6 | 4;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        local_360._8_8_ =
             (sourceName->Backtrace).TopEntry.
             super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        p_Var1 = (sourceName->Backtrace).TopEntry.
                 super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
        if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
          }
        }
        local_360._0_8_ = local_368;
        local_360._16_7_ = SUB87(p_Var1,0);
        local_360[0x17] = (undefined1)((ulong)p_Var1 >> 0x38);
        local_360._24_4_ = uVar15;
        std::
        vector<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>
        ::emplace_back<cmGeneratorTarget::SourceAndKind>
                  (&local_2e0->Sources,(SourceAndKind *)local_360);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            CONCAT17(local_360[0x17],local_360._16_7_) !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     CONCAT17(local_360[0x17],local_360._16_7_));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_allocated_capacity != local_268) {
          operator_delete((void *)local_278._M_allocated_capacity,
                          local_268[0]._M_allocated_capacity + 1);
        }
      }
      sourceName = sourceName + 1;
    } while (sourceName !=
             local_2c0.
             super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
    if (local_328._16_8_ != local_328._24_8_) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_278._M_local_buf);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_278,"OBJECT library \"",0x10);
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_278,(local_340->Target->Name)._M_dataplus._M_p,
                           (local_340->Target->Name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\" contains:\n",0xc);
      uVar4 = local_328._24_8_;
      if (local_328._16_8_ != local_328._24_8_) {
        ppcVar14 = (cmSourceFile **)local_328._16_8_;
        do {
          pcVar3 = *ppcVar14;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_278,"  ",2);
          pcVar12 = cmSourceFile::GetLocation(pcVar3);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_278,(pcVar12->Name)._M_dataplus._M_p,
                               (pcVar12->Name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
          ppcVar14 = ppcVar14 + 1;
        } while (ppcVar14 != (cmSourceFile **)uVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_278,
                 "but may contain only sources that compile, header files, and other files that would not affect linking of a normal library."
                 ,0x7b);
      this_00 = local_340->GlobalGenerator->CMakeInstance;
      std::__cxx11::stringbuf::str();
      GetBacktrace((cmGeneratorTarget *)local_338);
      cmake::IssueMessage(this_00,FATAL_ERROR,(string *)local_360,(cmListFileBacktrace *)local_338);
      if ((cmMakefile *)local_338._8_8_ != (cmMakefile *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_338._8_8_);
      }
      if ((cmSourceFile *)local_360._0_8_ != (cmSourceFile *)(local_360 + 0x10)) {
        operator_delete((void *)local_360._0_8_,CONCAT17(local_360[0x17],local_360._16_7_) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_278._M_local_buf);
      std::ios_base::~ios_base(local_208);
    }
  }
  std::
  _Rb_tree<cmSourceFile_*,_cmSourceFile_*,_std::_Identity<cmSourceFile_*>,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_>
  ::~_Rb_tree(&local_2a8);
  if ((cmSourceFile **)local_328._16_8_ != (cmSourceFile **)0x0) {
    operator_delete((void *)local_328._16_8_,local_308._0_8_ - local_328._16_8_);
  }
  if (local_100.program != (char *)0x0) {
    operator_delete__(local_100.program);
  }
  std::
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_2c0);
  return;
}

Assistant:

void cmGeneratorTarget::ComputeKindedSources(KindedSources& files,
                                             std::string const& config) const
{
  // Get the source file paths by string.
  std::vector<BT<std::string>> srcs = this->GetSourceFilePaths(config);

  cmsys::RegularExpression header_regex(CM_HEADER_REGEX);
  std::vector<cmSourceFile*> badObjLib;

  std::set<cmSourceFile*> emitted;
  for (BT<std::string> const& s : srcs) {
    // Create each source at most once.
    cmSourceFile* sf = this->Makefile->GetOrCreateSource(s.Value);
    if (!emitted.insert(sf).second) {
      continue;
    }

    // Compute the kind (classification) of this source file.
    SourceKind kind;
    std::string ext = cmSystemTools::LowerCase(sf->GetExtension());
    if (sf->GetCustomCommand()) {
      kind = SourceKindCustomCommand;
    } else if (this->Target->GetType() == cmStateEnums::UTILITY) {
      kind = SourceKindExtra;
    } else if (sf->GetPropertyAsBool("HEADER_FILE_ONLY")) {
      kind = SourceKindHeader;
    } else if (sf->GetPropertyAsBool("EXTERNAL_OBJECT")) {
      kind = SourceKindExternalObject;
    } else if (!sf->GetLanguage().empty()) {
      kind = SourceKindObjectSource;
    } else if (ext == "def") {
      kind = SourceKindModuleDefinition;
      if (this->GetType() == cmStateEnums::OBJECT_LIBRARY) {
        badObjLib.push_back(sf);
      }
    } else if (ext == "idl") {
      kind = SourceKindIDL;
      if (this->GetType() == cmStateEnums::OBJECT_LIBRARY) {
        badObjLib.push_back(sf);
      }
    } else if (ext == "resx") {
      kind = SourceKindResx;
      // Build and save the name of the corresponding .h file
      // This relationship will be used later when building the project files.
      // Both names would have been auto generated from Visual Studio
      // where the user supplied the file name and Visual Studio
      // appended the suffix.
      std::string resx = sf->GetFullPath();
      std::string hFileName = resx.substr(0, resx.find_last_of('.')) + ".h";
      files.ExpectedResxHeaders.insert(hFileName);
    } else if (ext == "appxmanifest") {
      kind = SourceKindAppManifest;
    } else if (ext == "manifest") {
      kind = SourceKindManifest;
    } else if (ext == "pfx") {
      kind = SourceKindCertificate;
    } else if (ext == "xaml") {
      kind = SourceKindXaml;
      // Build and save the name of the corresponding .h and .cpp file
      // This relationship will be used later when building the project files.
      // Both names would have been auto generated from Visual Studio
      // where the user supplied the file name and Visual Studio
      // appended the suffix.
      std::string xaml = sf->GetFullPath();
      std::string hFileName = xaml + ".h";
      std::string cppFileName = xaml + ".cpp";
      files.ExpectedXamlHeaders.insert(hFileName);
      files.ExpectedXamlSources.insert(cppFileName);
    } else if (header_regex.find(sf->GetFullPath())) {
      kind = SourceKindHeader;
    } else {
      kind = SourceKindExtra;
    }

    // Save this classified source file in the result vector.
    files.Sources.push_back({ BT<cmSourceFile*>(sf, s.Backtrace), kind });
  }

  if (!badObjLib.empty()) {
    std::ostringstream e;
    e << "OBJECT library \"" << this->GetName() << "\" contains:\n";
    for (cmSourceFile* i : badObjLib) {
      e << "  " << i->GetLocation().GetName() << "\n";
    }
    e << "but may contain only sources that compile, header files, and "
         "other files that would not affect linking of a normal library.";
    this->GlobalGenerator->GetCMakeInstance()->IssueMessage(
      MessageType::FATAL_ERROR, e.str(), this->GetBacktrace());
  }
}